

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O1

void write_file_text(vector<unsigned_int,_std::allocator<unsigned_int>_> *nums,string *file_name)

{
  pointer pcVar1;
  uint *puVar2;
  int iVar3;
  FILE *__stream;
  uint *num;
  uint *puVar4;
  string local_40;
  
  pcVar1 = (file_name->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + file_name->_M_string_length);
  __stream = (FILE *)fopen_or_fail(&local_40,"w");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  puVar2 = (nums->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar4 = (nums->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar4 != puVar2; puVar4 = puVar4 + 1) {
    fprintf(__stream,"%u\n",(ulong)*puVar4);
  }
  iVar3 = fclose(__stream);
  if (iVar3 == 0) {
    return;
  }
  quit("closing file failed");
}

Assistant:

void write_file_text(std::vector<uint32_t>& nums, std::string file_name)
{
    std::vector<uint32_t> content;
    auto fd = fopen_or_fail(file_name, "w");
    for (auto& num : nums) {
        fprintf(fd, "%u\n", num);
    }
    fclose_or_fail(fd);
}